

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::resize
          (GLTextureBuffer *this,uint newX,uint newY)

{
  runtime_error *this_00;
  socklen_t in_ECX;
  uint in_EDX;
  sockaddr *__addr;
  uint in_ESI;
  TextureBuffer *in_RDI;
  
  TextureBuffer::resize(in_RDI,in_ESI,in_EDX);
  bind((GLTextureBuffer *)in_RDI,in_ESI,__addr,in_ECX);
  if (in_RDI->dim == 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"OpenGL error: called 2D resize on 1D texture");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  checkGLError(true);
  return;
}

Assistant:

void GLTextureBuffer::resize(unsigned int newX, unsigned int newY) {

  TextureBuffer::resize(newX, newY);

  bind();
  if (dim == 1) {
    throw std::runtime_error("OpenGL error: called 2D resize on 1D texture");
  }
  if (dim == 2) {
  }
  checkGLError();
}